

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadReckoningCalculator.h
# Opt level: O2

Matrix<float,_(unsigned_char)__x03_,_(unsigned_char)__x03_> * __thiscall
KDIS::UTILS::Matrix<float,_(unsigned_char)'\x03',_(unsigned_char)'\x03'>::operator+
          (Matrix<float,_(unsigned_char)__x03_,_(unsigned_char)__x03_> *__return_storage_ptr__,
          Matrix<float,_(unsigned_char)__x03_,_(unsigned_char)__x03_> *this,
          Matrix<float,_(unsigned_char)__x03_,_(unsigned_char)__x03_> *Value)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  Matrix<float,_(unsigned_char)__x03_,_(unsigned_char)__x03_> *pMVar4;
  KUINT16 i;
  long lVar5;
  long lVar6;
  
  pMVar4 = __return_storage_ptr__;
  __return_storage_ptr__->Data[2][2] = this->Data[2][2];
  uVar1 = *(undefined8 *)this->Data[0];
  uVar2 = *(undefined8 *)(this->Data[0] + 2);
  uVar3 = *(undefined8 *)this->Data[2];
  *(undefined8 *)(__return_storage_ptr__->Data[1] + 1) = *(undefined8 *)(this->Data[1] + 1);
  *(undefined8 *)__return_storage_ptr__->Data[2] = uVar3;
  *(undefined8 *)__return_storage_ptr__->Data[0] = uVar1;
  *(undefined8 *)(__return_storage_ptr__->Data[0] + 2) = uVar2;
  for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
    for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
      (*(float (*) [3])*(float (*) [3])__return_storage_ptr__)[lVar6] =
           (*(float (*) [3])*(float (*) [3])Value)[lVar6] +
           (*(float (*) [3])*(float (*) [3])__return_storage_ptr__)[lVar6];
    }
    Value = (Matrix<float,_(unsigned_char)__x03_,_(unsigned_char)__x03_> *)((long)Value + 0xc);
    __return_storage_ptr__ =
         (Matrix<float,_(unsigned_char)__x03_,_(unsigned_char)__x03_> *)
         ((long)__return_storage_ptr__ + 0xc);
  }
  return pMVar4;
}

Assistant:

Matrix operator + ( const Matrix & Value )
    {
        Matrix m = *this;
        for( KUINT16 i = 0; i < cols; ++i )
        {
            for( KUINT16 j = 0; j < rows; ++j )
            {
                m.Data[i][j] += Value.Data[i][j];
            }
        }

        return m;
    }